

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::local_m_map_t::local_m_map_t(local_m_map_t *this,local_m_map_t *m)

{
  uint uVar1;
  const_reference ppmVar2;
  map_t *pmVar3;
  reference ppmVar4;
  uint local_38;
  loc_id_t id;
  allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*> local_21;
  value_type local_20;
  local_m_map_t *local_18;
  local_m_map_t *m_local;
  local_m_map_t *this_local;
  
  this->_loc_nb = m->_loc_nb;
  this->_clock_nb = m->_clock_nb;
  uVar1 = this->_loc_nb;
  local_20 = (value_type)0x0;
  local_18 = m;
  m_local = this;
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  allocator(&local_21);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_M,(ulong)uVar1,&local_20,&local_21);
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  ~allocator(&local_21);
  for (local_38 = 0; local_38 < this->_loc_nb; local_38 = local_38 + 1) {
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&local_18->_M,(ulong)local_38);
    pmVar3 = clone_map(*ppmVar2);
    ppmVar4 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_M,(ulong)local_38);
    *ppmVar4 = pmVar3;
  }
  return;
}

Assistant:

local_m_map_t::local_m_map_t(tchecker::clockbounds::local_m_map_t const & m)
    : _loc_nb(m._loc_nb), _clock_nb(m._clock_nb), _M(_loc_nb, nullptr)
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
    _M[id] = tchecker::clockbounds::clone_map(*m._M[id]);
}